

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_codecvt.h
# Opt level: O2

code_point
booster::locale::utf8_codecvt<wchar_t>::from_unicode
          (state_type *param_1,code_point u,char *begin,char *end)

{
  uint uVar1;
  
  if ((u & 0x1ff800) == 0xd800 || 0x10ffff < u) {
    uVar1 = 0xffffffff;
  }
  else {
    if (u < 0x80) {
      uVar1 = 1;
    }
    else if (u < 0x800) {
      uVar1 = 2;
    }
    else {
      uVar1 = 4 - (u < 0x10000);
    }
    if ((long)end - (long)begin < (long)(ulong)uVar1) {
      uVar1 = 0xfffffffe;
    }
    else {
      utf::utf_traits<char,1>::encode<char*>(u,begin);
    }
  }
  return uVar1;
}

Assistant:

static utf::code_point from_unicode(state_type &,utf::code_point u,char *begin,char const *end) 
    {
        if(!utf::is_valid_codepoint(u))
            return utf::illegal;
        int width;
        if((width=utf::utf_traits<char>::width(u)) > end - begin)
            return utf::incomplete;
        utf::utf_traits<char>::encode(u,begin);
        return width;
    }